

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_path_list_predicate
                 (lyd_node *node,char **buffer,size_t *buflen,size_t *bufused,ly_bool is_static)

{
  LY_ERR LVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  bool bVar6;
  char local_51;
  LY_ERR ret__;
  char quot;
  char *val;
  size_t len;
  lyd_node *key;
  ly_bool is_static_local;
  size_t *bufused_local;
  size_t *buflen_local;
  char **buffer_local;
  lyd_node *node_local;
  
  len = (size_t)lyd_child(node);
  while( true ) {
    bVar6 = false;
    if ((len != 0) && (bVar6 = false, *(long *)(len + 8) != 0)) {
      bVar6 = (*(ushort *)(*(long *)(len + 8) + 2) & 0x100) != 0;
    }
    if (!bVar6) break;
    __s = lyd_get_value((lyd_node *)len);
    sVar3 = strlen(*(char **)(*(long *)(len + 8) + 0x28));
    sVar4 = strlen(__s);
    LVar1 = lyd_path_str_enlarge(buffer,buflen,*bufused + sVar3 + sVar4 + 5,is_static);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    local_51 = '\'';
    pcVar5 = strchr(__s,0x27);
    if (pcVar5 != (char *)0x0) {
      local_51 = '\"';
    }
    iVar2 = sprintf(*buffer + *bufused,"[%s=%c%s%c]",*(undefined8 *)(*(long *)(len + 8) + 0x28),
                    (ulong)(uint)(int)local_51,__s,(ulong)(uint)(int)local_51);
    *bufused = (long)iVar2 + *bufused;
    len = *(size_t *)(len + 0x18);
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyd_path_list_predicate(const struct lyd_node *node, char **buffer, size_t *buflen, size_t *bufused, ly_bool is_static)
{
    const struct lyd_node *key;
    size_t len;
    const char *val;
    char quot;

    for (key = lyd_child(node); key && key->schema && (key->schema->flags & LYS_KEY); key = key->next) {
        val = lyd_get_value(key);
        len = 1 + strlen(key->schema->name) + 2 + strlen(val) + 2;
        LY_CHECK_RET(lyd_path_str_enlarge(buffer, buflen, *bufused + len, is_static));

        quot = '\'';
        if (strchr(val, '\'')) {
            quot = '"';
        }
        *bufused += sprintf(*buffer + *bufused, "[%s=%c%s%c]", key->schema->name, quot, val, quot);
    }

    return LY_SUCCESS;
}